

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogUnWrapURN(xmlChar *urn)

{
  xmlChar xVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  xmlChar *pxVar5;
  xmlChar result [2000];
  
  iVar2 = xmlStrncmp(urn,(xmlChar *)"urn:publicid:",0xd);
  if (iVar2 != 0) {
    return (xmlChar *)0x0;
  }
  pxVar5 = urn + 0xd;
  uVar4 = 0;
LAB_00160b7f:
  do {
    while( true ) {
      xVar1 = *pxVar5;
      uVar3 = (uint)uVar4;
      if ((xVar1 == '\0') || (0x7cc < uVar3)) {
        result[uVar4] = '\0';
        pxVar5 = xmlStrdup(result);
        return pxVar5;
      }
      if (xVar1 == '%') break;
      if (xVar1 == ';') {
        (result + uVar4)[0] = ':';
        (result + uVar4)[1] = ':';
LAB_00160bc5:
        pxVar5 = pxVar5 + 1;
        uVar4 = (ulong)(uVar3 + 2);
      }
      else {
        if (xVar1 == ':') {
          (result + uVar4)[0] = '/';
          (result + uVar4)[1] = '/';
          goto LAB_00160bc5;
        }
        if (xVar1 == '+') {
          result[uVar4] = ' ';
          pxVar5 = pxVar5 + 1;
          uVar4 = (ulong)(uVar3 + 1);
        }
        else {
          result[uVar4] = xVar1;
          pxVar5 = pxVar5 + 1;
          uVar4 = (ulong)(uVar3 + 1);
        }
      }
    }
    if (pxVar5[1] == '3') {
      xVar1 = pxVar5[2];
      if (xVar1 == 'A') {
        xVar1 = ':';
      }
      else if (xVar1 == 'B') {
        xVar1 = ';';
      }
      else {
        if (xVar1 != 'F') goto LAB_00160c1e;
        xVar1 = '?';
      }
    }
    else {
      if (pxVar5[1] != '2') {
LAB_00160c1e:
        pxVar5 = pxVar5 + 1;
        result[uVar4] = '%';
        uVar4 = (ulong)(uVar3 + 1);
        goto LAB_00160b7f;
      }
      xVar1 = pxVar5[2];
      if (xVar1 == '3') {
        xVar1 = '#';
      }
      else if (xVar1 == '5') {
        xVar1 = '%';
      }
      else if (xVar1 == '7') {
        xVar1 = '\'';
      }
      else if (xVar1 == 'B') {
        xVar1 = '+';
      }
      else {
        if (xVar1 != 'F') goto LAB_00160c1e;
        xVar1 = '/';
      }
    }
    result[uVar4] = xVar1;
    pxVar5 = pxVar5 + 3;
    uVar4 = (ulong)(uVar3 + 1);
  } while( true );
}

Assistant:

static xmlChar *
xmlCatalogUnWrapURN(const xmlChar *urn) {
    xmlChar result[2000];
    unsigned int i = 0;

    if (xmlStrncmp(urn, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1))
	return(NULL);
    urn += sizeof(XML_URN_PUBID) - 1;

    while (*urn != 0) {
	if (i > sizeof(result) - 4)
	    break;
	if (*urn == '+') {
	    result[i++] = ' ';
	    urn++;
	} else if (*urn == ':') {
	    result[i++] = '/';
	    result[i++] = '/';
	    urn++;
	} else if (*urn == ';') {
	    result[i++] = ':';
	    result[i++] = ':';
	    urn++;
	} else if (*urn == '%') {
	    if ((urn[1] == '2') && (urn[2] == 'B'))
		result[i++] = '+';
	    else if ((urn[1] == '3') && (urn[2] == 'A'))
		result[i++] = ':';
	    else if ((urn[1] == '2') && (urn[2] == 'F'))
		result[i++] = '/';
	    else if ((urn[1] == '3') && (urn[2] == 'B'))
		result[i++] = ';';
	    else if ((urn[1] == '2') && (urn[2] == '7'))
		result[i++] = '\'';
	    else if ((urn[1] == '3') && (urn[2] == 'F'))
		result[i++] = '?';
	    else if ((urn[1] == '2') && (urn[2] == '3'))
		result[i++] = '#';
	    else if ((urn[1] == '2') && (urn[2] == '5'))
		result[i++] = '%';
	    else {
		result[i++] = *urn;
		urn++;
		continue;
	    }
	    urn += 3;
	} else {
	    result[i++] = *urn;
	    urn++;
	}
    }
    result[i] = 0;

    return(xmlStrdup(result));
}